

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cert.cc
# Opt level: O1

bool bssl::ssl_parse_cert_chain
               (uint8_t *out_alert,UniquePtr<struct_stack_st_CRYPTO_BUFFER> *out_chain,
               UniquePtr<EVP_PKEY> *out_pubkey,uint8_t *out_leaf_sha256,CBS *cbs,
               CRYPTO_BUFFER_POOL *pool)

{
  _Head_base<0UL,_evp_pkey_st_*,_false> _Var1;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> __p;
  int iVar2;
  size_t sVar3;
  CRYPTO_BUFFER *p;
  bool bVar4;
  bool bVar5;
  UniquePtr<CRYPTO_BUFFER> buf;
  UniquePtr<EVP_PKEY> pubkey;
  UniquePtr<struct_stack_st_CRYPTO_BUFFER> chain;
  CBS certificate_list;
  CBS certificate;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_88;
  _Head_base<0UL,_evp_pkey_st_*,_false> local_80;
  _Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false> local_78;
  uint8_t *local_70;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_68;
  uint8_t *local_60;
  CBS local_58;
  __uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *local_48;
  CBS local_40;
  
  local_60 = out_leaf_sha256;
  std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)out_chain,
             (pointer)0x0);
  local_48 = (__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)out_pubkey;
  std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset
            ((__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter> *)out_pubkey,(pointer)0x0);
  iVar2 = CBS_get_u24_length_prefixed(cbs,&local_58);
  if (iVar2 == 0) {
    *out_alert = '2';
    bVar4 = false;
    ERR_put_error(0x10,0,0x89,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                  ,0x85);
  }
  else if (local_58.len == 0) {
    bVar4 = true;
  }
  else {
    local_78._M_head_impl = (stack_st_CRYPTO_BUFFER *)OPENSSL_sk_new_null();
    if ((OPENSSL_STACK *)local_78._M_head_impl == (OPENSSL_STACK *)0x0) {
      *out_alert = 'P';
      bVar4 = false;
    }
    else {
      local_80._M_head_impl = (evp_pkey_st *)0x0;
      bVar4 = local_58.len == 0;
      if (!bVar4) {
        local_70 = out_alert;
        do {
          iVar2 = CBS_get_u24_length_prefixed(&local_58,&local_40);
          if ((iVar2 == 0) || (local_40.len == 0)) {
            *local_70 = '2';
            ERR_put_error(0x10,0,0x7f,
                          "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_cert.cc"
                          ,0x99);
            goto LAB_0014f217;
          }
          sVar3 = OPENSSL_sk_num((OPENSSL_STACK *)local_78._M_head_impl);
          if (sVar3 == 0) {
            ssl_cert_parse_pubkey((bssl *)&local_88,&local_40);
            _Var1._M_head_impl = local_80._M_head_impl;
            local_80._M_head_impl = local_88._M_head_impl;
            local_88._M_head_impl = (evp_pkey_st *)0x0;
            if ((EVP_PKEY *)_Var1._M_head_impl != (EVP_PKEY *)0x0) {
              EVP_PKEY_free((EVP_PKEY *)_Var1._M_head_impl);
            }
            std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_88);
            if ((EVP_PKEY *)local_80._M_head_impl == (EVP_PKEY *)0x0) {
              *local_70 = '2';
              goto LAB_0014f217;
            }
            if (local_60 != (uchar *)0x0) {
              SHA256(local_40.data,local_40.len,local_60);
            }
          }
          p = CRYPTO_BUFFER_new_from_CBS(&local_40,pool);
          if (p == (CRYPTO_BUFFER *)0x0) {
            bVar5 = true;
            local_88._M_head_impl = (evp_pkey_st *)0x0;
          }
          else {
            local_88._M_head_impl = (evp_pkey_st *)0x0;
            local_68._M_head_impl = p;
            sVar3 = OPENSSL_sk_push((OPENSSL_STACK *)local_78._M_head_impl,p);
            bVar5 = sVar3 == 0;
            if (!bVar5) {
              local_68._M_head_impl = (CRYPTO_BUFFER *)0x0;
            }
          }
          if (p != (CRYPTO_BUFFER *)0x0) {
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_68);
          }
          if (bVar5) {
            *local_70 = 'P';
            std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                      ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_88);
            goto LAB_0014f217;
          }
          std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                    ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_88);
          bVar4 = local_58.len == 0;
        } while (!bVar4);
      }
      __p._M_head_impl = local_78._M_head_impl;
      local_78._M_head_impl = (stack_st_CRYPTO_BUFFER *)0x0;
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)out_chain,
                 __p._M_head_impl);
      _Var1._M_head_impl = local_80._M_head_impl;
      local_80._M_head_impl = (evp_pkey_st *)0x0;
      std::__uniq_ptr_impl<evp_pkey_st,_bssl::internal::Deleter>::reset(local_48,_Var1._M_head_impl)
      ;
LAB_0014f217:
      std::unique_ptr<evp_pkey_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<evp_pkey_st,_bssl::internal::Deleter> *)&local_80);
    }
    std::unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::~unique_ptr
              ((unique_ptr<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)&local_78);
  }
  return bVar4;
}

Assistant:

bool ssl_parse_cert_chain(uint8_t *out_alert,
                          UniquePtr<STACK_OF(CRYPTO_BUFFER)> *out_chain,
                          UniquePtr<EVP_PKEY> *out_pubkey,
                          uint8_t *out_leaf_sha256, CBS *cbs,
                          CRYPTO_BUFFER_POOL *pool) {
  out_chain->reset();
  out_pubkey->reset();

  CBS certificate_list;
  if (!CBS_get_u24_length_prefixed(cbs, &certificate_list)) {
    *out_alert = SSL_AD_DECODE_ERROR;
    OPENSSL_PUT_ERROR(SSL, SSL_R_DECODE_ERROR);
    return false;
  }

  if (CBS_len(&certificate_list) == 0) {
    return true;
  }

  UniquePtr<STACK_OF(CRYPTO_BUFFER)> chain(sk_CRYPTO_BUFFER_new_null());
  if (!chain) {
    *out_alert = SSL_AD_INTERNAL_ERROR;
    return false;
  }

  UniquePtr<EVP_PKEY> pubkey;
  while (CBS_len(&certificate_list) > 0) {
    CBS certificate;
    if (!CBS_get_u24_length_prefixed(&certificate_list, &certificate) ||
        CBS_len(&certificate) == 0) {
      *out_alert = SSL_AD_DECODE_ERROR;
      OPENSSL_PUT_ERROR(SSL, SSL_R_CERT_LENGTH_MISMATCH);
      return false;
    }

    if (sk_CRYPTO_BUFFER_num(chain.get()) == 0) {
      pubkey = ssl_cert_parse_pubkey(&certificate);
      if (!pubkey) {
        *out_alert = SSL_AD_DECODE_ERROR;
        return false;
      }

      // Retain the hash of the leaf certificate if requested.
      if (out_leaf_sha256 != NULL) {
        SHA256(CBS_data(&certificate), CBS_len(&certificate), out_leaf_sha256);
      }
    }

    UniquePtr<CRYPTO_BUFFER> buf(
        CRYPTO_BUFFER_new_from_CBS(&certificate, pool));
    if (!buf ||  //
        !PushToStack(chain.get(), std::move(buf))) {
      *out_alert = SSL_AD_INTERNAL_ERROR;
      return false;
    }
  }

  *out_chain = std::move(chain);
  *out_pubkey = std::move(pubkey);
  return true;
}